

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

S2Point * __thiscall
S2Builder::GetCoverageEndpoint
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *p,S2Point *x,S2Point *y,
          S2Point *n)

{
  double *pdVar1;
  D local_108;
  double local_f0;
  double local_e8;
  undefined1 local_e0 [8];
  Vector3_d mr;
  double mr2;
  undefined1 local_b8 [8];
  Vector3_d om;
  Vector3<double> local_88;
  undefined1 local_70 [8];
  S2Point nXpXn;
  S2Point nXp;
  double nDp;
  double n2;
  S2Point *n_local;
  S2Point *y_local;
  S2Point *x_local;
  S2Point *p_local;
  S2Builder *this_local;
  
  n2 = (double)n;
  n_local = y;
  y_local = x;
  x_local = p;
  p_local = (S2Point *)this;
  nDp = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                  ((BasicVector<Vector3,_double,_3UL> *)n);
  nXp.c_[2] = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)n2,x_local);
  Vector3<double>::CrossProd((Vector3<double> *)(nXpXn.c_ + 2),(Vector3<double> *)n2,x_local);
  util::math::internal_vector::operator*
            (&local_88,&nDp,(BasicVector<Vector3,_double,_3UL> *)x_local);
  util::math::internal_vector::operator*
            ((Vector3<double> *)(om.c_ + 2),nXp.c_ + 2,(BasicVector<Vector3,_double,_3UL> *)n2);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)local_70,(BasicVector<Vector3,_double,_3UL> *)&local_88,(D *)(om.c_ + 2));
  mr2 = sqrt(1.0 - this->edge_snap_radius_sin2_);
  util::math::internal_vector::operator*
            ((Vector3<double> *)local_b8,&mr2,(BasicVector<Vector3,_double,_3UL> *)local_70);
  mr.c_[2] = this->edge_snap_radius_sin2_ * nDp - nXp.c_[2] * nXp.c_[2];
  local_f0 = 0.0;
  pdVar1 = std::max<double>(&local_f0,mr.c_ + 2);
  local_e8 = sqrt(*pdVar1);
  util::math::internal_vector::operator*
            ((Vector3<double> *)local_e0,&local_e8,
             (BasicVector<Vector3,_double,_3UL> *)(nXpXn.c_ + 2));
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            (&local_108,(BasicVector<Vector3,_double,_3UL> *)local_b8,(D *)local_e0);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Builder::GetCoverageEndpoint(const S2Point& p, const S2Point& x,
                                       const S2Point& y, const S2Point& n)
    const {
  // Consider the plane perpendicular to P that cuts off a spherical cap of
  // radius snap_radius().  This plane intersects the plane through the edge
  // XY (perpendicular to N) along a line, and that line intersects the unit
  // sphere at two points Q and R, and we want to return the point R that is
  // further along the edge XY toward Y.
  //
  // Let M be the midpoint of QR.  This is the point along QR that is closest
  // to P.  We can now express R as the sum of two perpendicular vectors OM
  // and MR in the plane XY.  Vector MR is in the direction N x P, while
  // vector OM is in the direction (N x P) x N, where N = X x Y.
  //
  // The length of OM can be found using the Pythagorean theorem on triangle
  // OPM, and the length of MR can be found using the Pythagorean theorem on
  // triangle OMR.
  //
  // In the calculations below, we save some work by scaling all the vectors
  // by n.CrossProd(p).Norm2(), and normalizing at the end.
  double n2 = n.Norm2();
  double nDp = n.DotProd(p);
  S2Point nXp = n.CrossProd(p);
  S2Point nXpXn = n2 * p - nDp * n;
  Vector3_d om = sqrt(1 - edge_snap_radius_sin2_) * nXpXn;
  double mr2 = edge_snap_radius_sin2_ * n2 - nDp * nDp;

  // MR is constructed so that it points toward Y (rather than X).
  Vector3_d mr = sqrt(max(0.0, mr2)) * nXp;
  return (om + mr).Normalize();
}